

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QRegion * __thiscall QWidgetPrivate::getOpaqueChildren(QWidgetPrivate *this)

{
  QRegionData *pQVar1;
  QWidget *this_00;
  QWidgetPrivate *this_01;
  QWidgetData *pQVar2;
  QWExtra *pQVar3;
  char cVar4;
  QRegion *pQVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  QRegion r;
  QRect local_58;
  QRegion local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x252 & 1) != 0) {
    QRegion::QRegion((QRegion *)&local_58);
    pQVar1 = (this->opaqueChildren).d;
    (this->opaqueChildren).d = (QRegionData *)local_58._0_8_;
    local_58._0_8_ = pQVar1;
    QRegion::~QRegion((QRegion *)&local_58);
    for (uVar6 = 0; uVar6 < *(ulong *)&this->field_0x28; uVar6 = uVar6 + 1) {
      this_00 = *(QWidget **)(*(long *)&this->field_0x20 + uVar6 * 8);
      if ((((this_00 != (QWidget *)0x0) &&
           (this_01 = *(QWidgetPrivate **)&this_00->field_0x8, (this_01->field_0x30 & 1) != 0)) &&
          (pQVar2 = this_00->data, (pQVar2->widget_attributes & 0x8000) != 0)) &&
         (((pQVar2->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
        local_40.xp.m_i = (pQVar2->crect).x1.m_i;
        local_40.yp.m_i = (pQVar2->crect).y1.m_i;
        local_48.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        if ((*(uint *)&this_01->field_0x250 >> 0x11 & 1) == 0) {
          pQVar5 = getOpaqueChildren(this_01);
          QRegion::QRegion(&local_48,pQVar5);
        }
        else {
          local_58 = QWidget::rect(this_00);
          QRegion::QRegion(&local_48,&local_58,Rectangle);
        }
        pQVar3 = (this_01->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if ((pQVar3 != (QWExtra *)0x0) && ((pQVar3->field_0x7c & 0x80) != 0)) {
          QRegion::operator&=(&local_48,&pQVar3->mask);
        }
        cVar4 = QRegion::isEmpty();
        if (cVar4 == '\0') {
          QRegion::translate(&local_48,&local_40);
          QRegion::operator+=(&this->opaqueChildren,&local_48);
        }
        QRegion::~QRegion(&local_48);
      }
    }
    local_58 = QWidget::rect(*(QWidget **)&this->field_0x8);
    QRegion::operator&=(&this->opaqueChildren,&local_58);
    this->field_0x252 = this->field_0x252 & 0xfe;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &this->opaqueChildren;
}

Assistant:

const QRegion &QWidgetPrivate::getOpaqueChildren() const
{
    if (!dirtyOpaqueChildren)
        return opaqueChildren;

    QWidgetPrivate *that = const_cast<QWidgetPrivate*>(this);
    that->opaqueChildren = QRegion();

    for (int i = 0; i < children.size(); ++i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || !child->isVisible() || child->isWindow())
            continue;

        const QPoint offset = child->geometry().topLeft();
        QWidgetPrivate *childd = child->d_func();
        QRegion r = childd->isOpaque ? child->rect() : childd->getOpaqueChildren();
        if (childd->extra && childd->extra->hasMask)
            r &= childd->extra->mask;
        if (r.isEmpty())
            continue;
        r.translate(offset);
        that->opaqueChildren += r;
    }

    that->opaqueChildren &= q_func()->rect();
    that->dirtyOpaqueChildren = false;

    return that->opaqueChildren;
}